

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

string * __thiscall pbrt::MeasuredBxDF::ToString_abi_cxx11_(MeasuredBxDF *this)

{
  string *in_RDI;
  MeasuredBRDF *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::MeasuredBRDF_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string MeasuredBxDF::ToString() const {
    return StringPrintf("[ MeasuredBxDF brdf: %s ]", *brdf);
}